

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O1

ValueType * __thiscall
nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
          (InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *this,
          CoordType *ijk,ReadAccessor<float,_0,_1,_2> *acc)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)ijk->mVec;
  auVar6 = vpsllvd_avx2(auVar6,_DAT_02c8d320);
  auVar5._8_8_ = 0xf000000f00;
  auVar5._0_8_ = 0xf000000f00;
  auVar5 = vpandq_avx512vl(auVar6,auVar5);
  auVar6 = vpshufd_avx(auVar5,0x55);
  auVar6 = vpor_avx(auVar6,auVar5);
  uVar4 = (ulong)((uint)ijk->mVec[2] >> 3 & 0xf | auVar6._0_4_);
  if ((*(ulong *)(this + (ulong)(auVar6._0_4_ >> 6) * 8 + 0x220) >> (uVar4 & 0x3f) & 1) != 0) {
    iVar1 = *(int *)(this + 0x18);
    uVar2 = *(uint *)(this + uVar4 * 4 + 0x440);
    (acc->mKey).mVec[2] = ijk->mVec[2];
    *(undefined8 *)(acc->mKey).mVec = *(undefined8 *)ijk->mVec;
    acc->mNode[0] = this + (ulong)uVar2 * 0x860 + (long)iVar1 * 0x4440;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)ijk->mVec;
    auVar6 = vpsllvd_avx2(auVar7,_DAT_02c8d340);
    auVar3._8_8_ = 0x38000001c0;
    auVar3._0_8_ = 0x38000001c0;
    auVar5 = vpandq_avx512vl(auVar6,auVar3);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar6 = vpor_avx(auVar6,auVar5);
    return (ValueType *)
           (this + (ulong)uVar2 * 0x860 + (long)iVar1 * 0x4440 +
           (ulong)(ijk->mVec[2] & 7U | auVar6._0_4_) * 4 + 0x60);
  }
  return (ValueType *)(this + uVar4 * 4 + 0x440);
}

Assistant:

__hostdev__ static uint32_t CoordToOffset(const CoordType& ijk)
    {
        return (((ijk[0] & MASK) >> ChildT::TOTAL) << (2 * LOG2DIM)) +
               (((ijk[1] & MASK) >> ChildT::TOTAL) << (LOG2DIM)) +
               ((ijk[2] & MASK) >> ChildT::TOTAL);
    }